

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reorder.cpp
# Opt level: O0

void Omega_h::reorder_by_globals(Mesh *mesh)

{
  int iVar1;
  Int IVar2;
  void **local_c0;
  undefined8 *local_a0;
  undefined1 local_98 [16];
  Read<int> local_88;
  int local_78;
  Int ent_dim;
  undefined1 local_68 [8];
  LOs new_ents2old_ents [4];
  Mesh *mesh_local;
  
  local_a0 = (undefined8 *)local_68;
  new_ents2old_ents[3].write_.shared_alloc_.direct_ptr = mesh;
  do {
    *local_a0 = 0;
    local_a0[1] = 0;
    local_a0 = local_a0 + 2;
  } while ((void **)local_a0 != &new_ents2old_ents[3].write_.shared_alloc_.direct_ptr);
  local_78 = 0;
  while( true ) {
    iVar1 = local_78;
    IVar2 = Mesh::dim((Mesh *)new_ents2old_ents[3].write_.shared_alloc_.direct_ptr);
    if (IVar2 < iVar1) break;
    Mesh::globals((Mesh *)local_98,(Int)new_ents2old_ents[3].write_.shared_alloc_.direct_ptr);
    sort_by_keys<long>((Omega_h *)&local_88,(Read<long> *)local_98,1);
    Read<int>::operator=
              ((Read<int> *)&new_ents2old_ents[(long)local_78 + -1].write_.shared_alloc_.direct_ptr,
               &local_88);
    Read<int>::~Read(&local_88);
    Read<long>::~Read((Read<long> *)local_98);
    local_78 = local_78 + 1;
  }
  unmap_mesh((Mesh *)new_ents2old_ents[3].write_.shared_alloc_.direct_ptr,(LOs *)local_68);
  local_c0 = &new_ents2old_ents[3].write_.shared_alloc_.direct_ptr;
  do {
    local_c0 = local_c0 + -2;
    Read<int>::~Read((Read<int> *)local_c0);
  } while (local_c0 != (void **)local_68);
  return;
}

Assistant:

void reorder_by_globals(Mesh* mesh) {
  LOs new_ents2old_ents[4];
  for (Int ent_dim = 0; ent_dim <= mesh->dim(); ++ent_dim) {
    new_ents2old_ents[ent_dim] = sort_by_keys(mesh->globals(ent_dim));
  }
  unmap_mesh(mesh, new_ents2old_ents);
}